

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int m_encode_zero(aec_stream *strm)

{
  int iVar1;
  internal_state *piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint8_t *puVar9;
  
  piVar2 = strm->state;
  iVar8 = piVar2->id_len;
  iVar1 = piVar2->bits;
  if (iVar8 < iVar1) {
    piVar2->bits = iVar1 - (iVar8 + 1);
  }
  else {
    iVar7 = (iVar8 + 1) - iVar1;
    puVar9 = piVar2->cds + 1;
    piVar2->cds = puVar9;
    if (8 < iVar7) {
      uVar4 = (iVar8 - iVar1) + 9;
      do {
        uVar6 = uVar4;
        puVar9 = piVar2->cds;
        piVar2->cds = puVar9 + 1;
        *puVar9 = '\0';
        uVar4 = uVar6 - 8;
      } while (0x10 < uVar4);
      puVar9 = piVar2->cds;
      iVar7 = uVar6 - 0x10;
    }
    piVar2->bits = 8 - iVar7;
    *puVar9 = '\0';
  }
  if (piVar2->zero_ref != 0) {
    iVar8 = piVar2->bits;
    uVar6 = piVar2->zero_ref_sample;
    uVar4 = strm->bits_per_sample;
    if (iVar8 < (int)uVar4) {
      uVar4 = uVar4 - iVar8;
      puVar9 = piVar2->cds;
      piVar2->cds = puVar9 + 1;
      *puVar9 = *puVar9 + (char)(uVar6 >> ((byte)uVar4 & 0x3f));
      uVar5 = uVar4;
      if (8 < (int)uVar4) {
        do {
          uVar4 = uVar5 - 8;
          puVar9 = piVar2->cds;
          piVar2->cds = puVar9 + 1;
          *puVar9 = (uint8_t)(uVar6 >> ((byte)uVar4 & 0x1f));
          bVar3 = 0x10 < uVar5;
          uVar5 = uVar4;
        } while (bVar3);
      }
      piVar2->bits = 8 - uVar4;
      *piVar2->cds = (uint8_t)(uVar6 << ((byte)(8 - uVar4) & 0x1f));
    }
    else {
      piVar2->bits = iVar8 - uVar4;
      *piVar2->cds = *piVar2->cds + (char)(uVar6 << ((byte)(iVar8 - uVar4) & 0x1f));
    }
  }
  uVar4 = piVar2->zero_blocks;
  if (uVar4 == 0xffffffff) {
    iVar8 = piVar2->bits;
    uVar4 = 0xfffffffb;
    if (iVar8 < 5) {
      uVar4 = 4;
      do {
        uVar4 = uVar4 - iVar8;
        puVar9 = piVar2->cds;
        piVar2->cds = puVar9 + 1;
        puVar9[1] = '\0';
        iVar8 = 8;
      } while (7 < (int)uVar4);
      goto LAB_00102ea9;
    }
  }
  else {
    if ((int)uVar4 < 5) {
      uVar6 = uVar4 - 1;
      iVar8 = piVar2->bits;
      if (iVar8 < (int)uVar4) {
        do {
          uVar6 = uVar6 - iVar8;
          puVar9 = piVar2->cds;
          piVar2->cds = puVar9 + 1;
          puVar9[1] = '\0';
          iVar8 = 8;
        } while (7 < (int)uVar6);
      }
      iVar8 = ~uVar6 + iVar8;
      goto LAB_00102ede;
    }
    iVar8 = piVar2->bits;
    if (iVar8 <= (int)uVar4) {
      do {
        uVar4 = uVar4 - iVar8;
        puVar9 = piVar2->cds;
        piVar2->cds = puVar9 + 1;
        puVar9[1] = '\0';
        iVar8 = 8;
      } while (7 < (int)uVar4);
    }
LAB_00102ea9:
    uVar4 = ~uVar4;
  }
  iVar8 = uVar4 + iVar8;
LAB_00102ede:
  piVar2->bits = iVar8;
  *piVar2->cds = *piVar2->cds + (char)(1 << ((byte)iVar8 & 0x1f));
  piVar2->zero_blocks = 0;
  m_flush_block(strm);
  return 1;
}

Assistant:

static int m_encode_zero(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    emit(state, 0, state->id_len + 1);

    if (state->zero_ref)
        emit(state, state->zero_ref_sample, strm->bits_per_sample);

    if (state->zero_blocks == ROS)
        emitfs(state, 4);
    else if (state->zero_blocks >= 5)
        emitfs(state, state->zero_blocks);
    else
        emitfs(state, state->zero_blocks - 1);

    state->zero_blocks = 0;
    return m_flush_block(strm);
}